

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_-1,_1>,_Eigen::internal::IndexBased,_double>
::coeff(unary_evaluator<Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
        *this,Index row,Index col)

{
  long lVar1;
  CoeffReturnType pdVar2;
  Index actual_col;
  Index actual_row;
  Index col_local;
  Index row_local;
  unary_evaluator<Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  *this_local;
  
  lVar1 = variable_if_dynamic<long,_1>::value();
  pdVar2 = evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
           ::coeff((evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&this->m_argImpl,row % lVar1,col);
  return *pdVar2;
}

Assistant:

CoeffReturnType coeff(Index row, Index col) const
  {
    // try to avoid using modulo; this is a pure optimization strategy
    const Index actual_row = internal::traits<XprType>::RowsAtCompileTime==1 ? 0
                           : RowFactor==1 ? row
                           : row % m_rows.value();
    const Index actual_col = internal::traits<XprType>::ColsAtCompileTime==1 ? 0
                           : ColFactor==1 ? col
                           : col % m_cols.value();
    
    return m_argImpl.coeff(actual_row, actual_col);
  }